

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O1

void tvm::contrib::argsort<long,long>(DLTensor *input,DLTensor *output,int32_t axis,bool is_ascend)

{
  int64_t *piVar1;
  iterator __last;
  uint uVar2;
  undefined7 in_register_00000009;
  __normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
  _Var3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> sorter;
  uint local_b4;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>,_std::pair<long,_long>_>
  local_b0;
  __normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
  local_98;
  iterator iStack_90;
  pair<long,_long> *local_88;
  long local_78;
  undefined4 local_6c;
  long local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  ulong local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,is_ascend);
  local_40 = input->data;
  local_48 = output->data;
  local_98._M_current = (pair<long,_long> *)0x0;
  iStack_90._M_current = (pair<long,_long> *)0x0;
  local_88 = (pair<long,_long> *)0x0;
  lVar6 = (long)axis;
  if ((long)input->ndim < 1) {
    local_b4 = 1;
    uVar2 = 1;
  }
  else {
    uVar2 = 1;
    lVar4 = 0;
    local_b4 = 1;
    do {
      if (lVar4 < lVar6) {
        uVar2 = uVar2 * (int)input->shape[lVar4];
      }
      else if (lVar6 < lVar4) {
        local_b4 = local_b4 * (int)input->shape[lVar4];
      }
      lVar4 = lVar4 + 1;
    } while (input->ndim != lVar4);
  }
  if (0 < (int)uVar2) {
    lVar4 = (long)(int)local_b4;
    local_60 = (ulong)uVar2;
    local_38 = (ulong)local_b4;
    local_78 = 0;
    uVar8 = 0;
    local_58 = lVar4;
    do {
      local_50 = uVar8;
      if (0 < (int)local_b4) {
        uVar8 = 0;
        do {
          if (iStack_90._M_current != local_98._M_current) {
            iStack_90._M_current = local_98._M_current;
          }
          local_68 = input->shape[lVar6];
          if (0 < local_68) {
            plVar5 = (long *)((long)local_40 + (local_78 * local_68 + uVar8) * 8);
            lVar7 = 0;
            do {
              local_b0._M_len = *plVar5;
              local_b0._M_original_len = lVar7;
              if (iStack_90._M_current == local_88) {
                std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                _M_realloc_insert<std::pair<long,long>>
                          ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                           &local_98,iStack_90,(pair<long,_long> *)&local_b0);
              }
              else {
                (iStack_90._M_current)->first = lVar7;
                (iStack_90._M_current)->second = local_b0._M_len;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
              lVar7 = lVar7 + 1;
              plVar5 = plVar5 + lVar4;
            } while (lVar7 < input->shape[lVar6]);
          }
          __last._M_current = iStack_90._M_current;
          _Var3._M_current = local_98._M_current;
          if ((char)local_6c == '\0') {
            if (local_98._M_current != iStack_90._M_current) {
              lVar7 = (long)iStack_90._M_current - (long)local_98._M_current >> 4;
              std::
              _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>,_std::pair<long,_long>_>
              ::_Temporary_buffer(&local_b0,local_98,(lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
              if (local_b0._M_buffer == (pair<long,_long> *)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,long>const&,std::pair<long,long>const&)>>
                          (_Var3,(__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
                                  )__last._M_current,
                           (_Iter_comp_iter<bool_(*)(const_std::pair<long,_long>_&,_const_std::pair<long,_long>_&)>
                            )0x12fabd);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,std::pair<long,long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,long>const&,std::pair<long,long>const&)>>
                          (_Var3,(__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
                                  )__last._M_current,local_b0._M_buffer,local_b0._M_len,
                           (_Iter_comp_iter<bool_(*)(const_std::pair<long,_long>_&,_const_std::pair<long,_long>_&)>
                            )0x12fabd);
              }
              goto LAB_0012bd6d;
            }
          }
          else if (local_98._M_current != iStack_90._M_current) {
            lVar7 = (long)iStack_90._M_current - (long)local_98._M_current >> 4;
            std::
            _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>,_std::pair<long,_long>_>
            ::_Temporary_buffer(&local_b0,local_98,(lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
            if (local_b0._M_buffer == (pair<long,_long> *)0x0) {
              std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,long>const&,std::pair<long,long>const&)>>
                        (_Var3,(__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
                                )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_long>_&,_const_std::pair<long,_long>_&)>
                          )0x12fab1);
            }
            else {
              std::
              __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,std::pair<long,long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,long>const&,std::pair<long,long>const&)>>
                        (_Var3,(__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
                                )__last._M_current,local_b0._M_buffer,local_b0._M_len,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_long>_&,_const_std::pair<long,_long>_&)>
                          )0x12fab1);
            }
LAB_0012bd6d:
            operator_delete(local_b0._M_buffer,local_b0._M_len << 4);
          }
          piVar1 = input->shape;
          if (0 < piVar1[lVar6]) {
            plVar5 = (long *)((long)local_48 + (local_68 * local_78 + uVar8) * 8);
            lVar7 = 0;
            _Var3._M_current = local_98._M_current;
            do {
              *plVar5 = (_Var3._M_current)->first;
              lVar7 = lVar7 + 1;
              plVar5 = plVar5 + lVar4;
              _Var3._M_current = _Var3._M_current + 1;
            } while (lVar7 < piVar1[lVar6]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != local_38);
      }
      uVar8 = local_50 + 1;
      local_78 = local_78 + local_58;
    } while (uVar8 != local_60);
  }
  if (local_98._M_current != (pair<long,_long> *)0x0) {
    operator_delete(local_98._M_current,(long)local_88 - (long)local_98._M_current);
  }
  return;
}

Assistant:

void argsort(DLTensor *input, DLTensor *output, int32_t axis, bool is_ascend) {
  auto data_ptr = static_cast<DataType *>(input->data);
  auto out_ptr = static_cast<OutType *>(output->data);
  std::vector<std::pair<int64_t, DataType>> sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }

  for (int i = 0; i < axis_mul_before; ++i) {
    for (int j = 0; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t base_idx = i * input->shape[axis] * axis_mul_after + j;
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        int64_t full_idx = base_idx + k * axis_mul_after;
        sorter.emplace_back(std::make_pair(k, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        out_ptr[base_idx + k * axis_mul_after] = static_cast<OutType>(sorter[k].first);
      }
    }
  }
}